

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O3

void x11_format_auth_for_authfile
               (BinarySink *bs,SockAddr *addr,int display_no,ptrlen authproto,ptrlen authdata)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  BinarySink *pBVar6;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  char local_48 [24];
  
  _Var1 = sk_address_is_special_local(addr);
  if (_Var1) {
    pcVar3 = get_hostname();
    BinarySink_put_uint16(bs->binarysink_,0x100);
    pBVar6 = bs->binarysink_;
    sVar4 = strlen(pcVar3);
    pl.len = sVar4;
    pl.ptr = pcVar3;
    BinarySink_put_stringpl_xauth(pBVar6,pl);
    safefree(pcVar3);
  }
  else {
    iVar2 = sk_addrtype(addr);
    if (iVar2 == 1) {
      sk_addrcopy(addr,local_48);
      BinarySink_put_uint16(bs->binarysink_,0);
      pBVar6 = bs->binarysink_;
      sVar5 = 4;
    }
    else {
      iVar2 = sk_addrtype(addr);
      if (iVar2 != 2) {
        __assert_fail("false && \"Bad address type in x11_format_auth_for_authfile\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/x11authfile.c"
                      ,0xe9,
                      "void x11_format_auth_for_authfile(BinarySink *, SockAddr *, int, ptrlen, ptrlen)"
                     );
      }
      sk_addrcopy(addr,local_48);
      BinarySink_put_uint16(bs->binarysink_,6);
      pBVar6 = bs->binarysink_;
      sVar5 = 0x10;
    }
    pl_00.len = sVar5;
    pl_00.ptr = local_48;
    BinarySink_put_stringpl_xauth(pBVar6,pl_00);
  }
  pcVar3 = dupprintf("%d",(ulong)(uint)display_no);
  pBVar6 = bs->binarysink_;
  sVar4 = strlen(pcVar3);
  pl_01.len = sVar4;
  pl_01.ptr = pcVar3;
  BinarySink_put_stringpl_xauth(pBVar6,pl_01);
  safefree(pcVar3);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authproto);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authdata);
  return;
}

Assistant:

void x11_format_auth_for_authfile(
    BinarySink *bs, SockAddr *addr, int display_no,
    ptrlen authproto, ptrlen authdata)
{
    if (sk_address_is_special_local(addr)) {
        char *ourhostname = get_hostname();
        put_uint16(bs, 256); /* indicates Unix-domain socket */
        put_stringpl_xauth(bs, ptrlen_from_asciz(ourhostname));
        sfree(ourhostname);
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV4) {
        char ipv4buf[4];
        sk_addrcopy(addr, ipv4buf);
        put_uint16(bs, 0); /* indicates IPv4 */
        put_stringpl_xauth(bs, make_ptrlen(ipv4buf, 4));
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV6) {
        char ipv6buf[16];
        sk_addrcopy(addr, ipv6buf);
        put_uint16(bs, 6); /* indicates IPv6 */
        put_stringpl_xauth(bs, make_ptrlen(ipv6buf, 16));
    } else {
        unreachable("Bad address type in x11_format_auth_for_authfile");
    }

    {
        char *numberbuf = dupprintf("%d", display_no);
        put_stringpl_xauth(bs, ptrlen_from_asciz(numberbuf));
        sfree(numberbuf);
    }

    put_stringpl_xauth(bs, authproto);
    put_stringpl_xauth(bs, authdata);
}